

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcexecutors.cpp
# Opt level: O2

void * testfunc_thread_starter(void *arg)

{
  int iVar1;
  __shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  std::__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_20,(__shared_ptr<trun::TestModule,_(__gnu_cxx::_Lock_policy)2> *)((long)arg + 8)
            );
  trun::TestRunner::SetCurrentTestModule((Ref *)&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  trun::TestRunner::SetCurrentTestRunner(*(TestRunner **)((long)arg + 0x18));
  iVar1 = trun::TestFuncExecutorSequential::Execute
                    (*(TestFuncExecutorSequential **)((long)arg + 0x38),*arg,
                     *(CBPrePostHook **)((long)arg + 0x20),*(CBPrePostHook **)((long)arg + 0x28));
  *(int *)((long)arg + 0x30) = iVar1;
  return (void *)0x0;
}

Assistant:

static void *testfunc_thread_starter(void *arg) {
    auto threadArg = reinterpret_cast<ThreadArg *>(arg);

    TestRunner::SetCurrentTestModule(threadArg->testModule);
    TestRunner::SetCurrentTestRunner(threadArg->testRunner);

    threadArg->returnValue = threadArg->executor->ThreadFunc(threadArg->testFunc, threadArg->cbPreHook, threadArg->cbPostHook);
    // Return NULL here as this is a C callback..
    return NULL;
}